

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void open_loop_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req->fs_type == UV_FS_OPEN) {
    if (req->result == -0x28) {
      open_cb_count = open_cb_count + 1;
      uv_fs_req_cleanup(req);
      return;
    }
    pcVar2 = "req->result == UV_ELOOP";
    uVar1 = 0x2c6;
  }
  else {
    pcVar2 = "req->fs_type == UV_FS_OPEN";
    uVar1 = 0x2c5;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void open_loop_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_OPEN);
  ASSERT(req->result == UV_ELOOP);
  open_cb_count++;
  uv_fs_req_cleanup(req);
}